

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

void compare_single_struct(t_struct *newStruct,t_struct *oldStruct,string *oldStructName)

{
  t_field *newField;
  t_field *oldField;
  bool bVar1;
  int iVar2;
  e_req eVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 extraout_var;
  members_type *this;
  members_type *this_00;
  reference pptVar8;
  undefined8 uVar9;
  bool local_111;
  bool local_10a;
  bool local_109;
  string *local_f8;
  string local_d0;
  t_field **local_b0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a0;
  t_field **local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  const_iterator newStructMemberIt;
  const_iterator oldStructMemberIt;
  vector<t_field_*,_std::allocator<t_field_*>_> *newStructMembersInIdOrder;
  vector<t_field_*,_std::allocator<t_field_*>_> *oldStructMembersInIdOrder;
  string structName;
  string *oldStructName_local;
  t_struct *oldStruct_local;
  t_struct *newStruct_local;
  
  structName.field_2._8_8_ = oldStructName;
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    local_f8 = (string *)structName.field_2._8_8_;
  }
  else {
    iVar2 = (*(oldStruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    local_f8 = (string *)CONCAT44(extraout_var,iVar2);
  }
  std::__cxx11::string::string((string *)&oldStructMembersInIdOrder,local_f8);
  this = t_struct::get_sorted_members(oldStruct);
  this_00 = t_struct::get_sorted_members(newStruct);
  newStructMemberIt = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this);
  local_70._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    local_78._M_current = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this);
    bVar1 = __gnu_cxx::operator==(&newStructMemberIt,&local_78);
    local_109 = false;
    if (bVar1) {
      local_80._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      local_109 = __gnu_cxx::operator==(&local_70,&local_80);
    }
    if (((local_109 ^ 0xffU) & 1) == 0) break;
    local_88._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator==(&local_70,&local_88);
    local_10a = false;
    if (bVar1) {
      local_90._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this);
      local_10a = __gnu_cxx::operator!=(&newStructMemberIt,&local_90);
    }
    if (local_10a == false) {
      local_a0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_a0);
      local_111 = false;
      if (bVar1) {
        local_a8._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this);
        local_111 = __gnu_cxx::operator==(&newStructMemberIt,&local_a8);
      }
      if (local_111 == false) {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_70);
        iVar4 = t_field::get_key(*pptVar8);
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&newStructMemberIt);
        iVar5 = t_field::get_key(*pptVar8);
        if (iVar4 == iVar5) {
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_70);
          newField = *pptVar8;
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&newStructMemberIt);
          oldField = *pptVar8;
          std::__cxx11::string::string((string *)&local_d0,(string *)&oldStructMembersInIdOrder);
          compare_struct_field(newField,oldField,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_70,0);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&newStructMemberIt,0);
        }
        else {
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_70);
          iVar4 = t_field::get_key(*pptVar8);
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&newStructMemberIt);
          iVar5 = t_field::get_key(*pptVar8);
          if (iVar4 < iVar5) {
            pptVar8 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*(&local_70);
            uVar6 = t_field::get_key(*pptVar8);
            uVar9 = std::__cxx11::string::c_str();
            thrift_audit_failure
                      ("Struct field is added in the middle with Id = %d in %s\n",(ulong)uVar6,uVar9
                      );
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++(&local_70,0);
          }
          else {
            pptVar8 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*(&local_70);
            iVar4 = t_field::get_key(*pptVar8);
            pptVar8 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*(&newStructMemberIt);
            iVar5 = t_field::get_key(*pptVar8);
            if (iVar5 < iVar4) {
              pptVar8 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*(&newStructMemberIt);
              uVar6 = t_field::get_key(*pptVar8);
              uVar9 = std::__cxx11::string::c_str();
              thrift_audit_failure("Struct Field removed for Id = %d in %s \n",(ulong)uVar6,uVar9);
              __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator++(&newStructMemberIt,0);
            }
          }
        }
      }
      else {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_70);
        eVar3 = t_field::get_req(*pptVar8);
        if (eVar3 == T_REQUIRED) {
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_70);
          uVar6 = t_field::get_key(*pptVar8);
          uVar9 = std::__cxx11::string::c_str();
          thrift_audit_failure
                    ("Required Struct Field Added for Id = %d in %s \n",(ulong)uVar6,uVar9);
        }
        local_b0 = (t_field **)
                   __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator++(&local_70,0);
      }
    }
    else {
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&newStructMemberIt);
      uVar6 = t_field::get_key(*pptVar8);
      uVar9 = std::__cxx11::string::c_str();
      thrift_audit_failure("Struct Field removed for Id = %d in %s \n",(ulong)uVar6,uVar9);
      local_98 = (t_field **)
                 __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator++(&newStructMemberIt,0);
    }
  }
  std::__cxx11::string::~string((string *)&oldStructMembersInIdOrder);
  return;
}

Assistant:

void compare_single_struct(t_struct* newStruct, t_struct* oldStruct, const std::string& oldStructName = std::string())
{
   std::string structName = oldStructName.empty() ? oldStruct->get_name() : oldStructName;
   const std::vector<t_field*>& oldStructMembersInIdOrder = oldStruct->get_sorted_members();
   const std::vector<t_field*>& newStructMembersInIdOrder = newStruct->get_sorted_members();
   auto oldStructMemberIt = oldStructMembersInIdOrder.begin();
   auto newStructMemberIt = newStructMembersInIdOrder.begin();

   // Since we have the struct members in their ID order, comparing their IDs can be done by traversing the two member
   // lists together.
   while(!(oldStructMemberIt == oldStructMembersInIdOrder.end() && newStructMemberIt == newStructMembersInIdOrder.end()))
   {
      if(newStructMemberIt == newStructMembersInIdOrder.end() && oldStructMemberIt != oldStructMembersInIdOrder.end())
      {
         // A field ID has been removed from the end.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n", (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }
      else if(newStructMemberIt != newStructMembersInIdOrder.end() && oldStructMemberIt == oldStructMembersInIdOrder.end())
      {
         //New field ID has been added to the end.
         if((*newStructMemberIt)->get_req() == t_field::T_REQUIRED)
         {
            thrift_audit_failure("Required Struct Field Added for Id = %d in %s \n", (*newStructMemberIt)->get_key(), structName.c_str());
         }
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() == (*oldStructMemberIt)->get_key())
      {
         //Field ID found in both structs. Compare field types, default values.
         compare_struct_field(*newStructMemberIt, *oldStructMemberIt, structName);

         newStructMemberIt++;
         oldStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() < (*oldStructMemberIt)->get_key())
      {
         //New Field Id is inserted in between
         //Adding fields to struct is fine, but adding them in the middle is suspicious. Error!!
         thrift_audit_failure("Struct field is added in the middle with Id = %d in %s\n",  (*newStructMemberIt)->get_key(),  structName.c_str());
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() > (*oldStructMemberIt)->get_key())
      {
         //A field is deleted in newStruct.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n",  (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }

   }
}